

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O1

bool tinyusdz::tydra::detail::BuildSkelHierarchyImpl
               (set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                *visitSet,SkelNode *parentNode,vector<int,_std::allocator<int>_> *parentJointIds,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *joints,
               vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *jointNames,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *bindTransforms,
               vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
               *restTransforms,string *err)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  pointer piVar3;
  _Base_ptr p_Var4;
  long lVar5;
  _Rb_tree_header *p_Var6;
  pointer pmVar7;
  double *pdVar8;
  byte bVar9;
  SkelNode node;
  string *err_00;
  vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_> local_1a8;
  undefined1 local_190 [32];
  _Alloc_hider local_170;
  size_type local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  int local_150;
  double local_148;
  double local_140;
  double dStack_138;
  double local_130;
  double dStack_128;
  double local_120;
  double local_118;
  double dStack_110;
  double local_108;
  double dStack_100;
  double local_f8;
  double local_f0;
  double dStack_e8;
  double local_e0;
  double dStack_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double dStack_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double dStack_58;
  double local_50;
  vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_> local_48;
  
  bVar9 = 0;
  err_00 = (string *)0x0;
  piVar3 = (parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    p_Var1 = &(visitSet->_M_t)._M_impl.super__Rb_tree_header;
    do {
      local_170._M_p = (pointer)&local_160;
      p_Var2 = (visitSet->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[*(string **)(p_Var2 + 1) < err_00]) {
        if (*(string **)(p_Var2 + 1) >= err_00) {
          p_Var4 = p_Var2;
        }
      }
      p_Var6 = p_Var1;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (p_Var6 = (_Rb_tree_header *)p_Var4,
         err_00 < (string *)((_Rb_tree_header *)p_Var4)->_M_node_count)) {
        p_Var6 = p_Var1;
      }
      if ((p_Var6 == p_Var1) && (parentNode->joint_id == piVar3[(long)err_00])) {
        local_190._8_8_ = 0;
        local_190[0x10] = '\0';
        local_168 = 0;
        local_160._M_local_buf[0] = '\0';
        local_148 = 1.0;
        local_130 = 0.0;
        dStack_128 = 0.0;
        local_140 = 0.0;
        dStack_138 = 0.0;
        local_120 = 1.0;
        local_108 = 0.0;
        dStack_100 = 0.0;
        local_118 = 0.0;
        dStack_110 = 0.0;
        local_f8 = 1.0;
        local_e0 = 0.0;
        dStack_d8 = 0.0;
        local_f0 = 0.0;
        dStack_e8 = 0.0;
        local_d0 = 1.0;
        local_c8 = 1.0;
        local_b0 = 0.0;
        dStack_a8 = 0.0;
        local_c0 = 0.0;
        dStack_b8 = 0.0;
        local_a0 = 1.0;
        local_88 = 0.0;
        dStack_80 = 0.0;
        local_98 = 0.0;
        dStack_90 = 0.0;
        local_78 = 1.0;
        local_60 = 0.0;
        dStack_58 = 0.0;
        local_70 = 0.0;
        dStack_68 = 0.0;
        local_50 = 1.0;
        local_48.
        super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48.
        super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.
        super__Vector_base<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_150 = (int)err_00;
        local_190._0_8_ = local_190 + 0x10;
        ::std::__cxx11::string::_M_assign((string *)local_190);
        ::std::__cxx11::string::_M_assign((string *)&local_170);
        pmVar7 = (bindTransforms->
                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                 )._M_impl.super__Vector_impl_data._M_start + (long)err_00;
        pdVar8 = &local_148;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *pdVar8 = pmVar7->m[0][0];
          pmVar7 = (pointer)((long)pmVar7 + ((ulong)bVar9 * -2 + 1) * 8);
          pdVar8 = pdVar8 + (ulong)bVar9 * -2 + 1;
        }
        pmVar7 = (restTransforms->
                 super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                 )._M_impl.super__Vector_impl_data._M_start + (long)err_00;
        pdVar8 = &local_c8;
        for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
          *pdVar8 = pmVar7->m[0][0];
          pmVar7 = (pointer)((long)pmVar7 + ((ulong)bVar9 * -2 + 1) * 8);
          pdVar8 = pdVar8 + (ulong)bVar9 * -2 + 1;
        }
        ::std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)visitSet,(unsigned_long *)&stack0xfffffffffffffe20);
        ::std::vector<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>::vector
                  (&local_1a8,bindTransforms);
        BuildSkelHierarchyImpl
                  (visitSet,(SkelNode *)local_190,parentJointIds,joints,jointNames,&local_1a8,
                   restTransforms,err_00);
        if (local_1a8.
            super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1a8.
                          super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1a8.
                                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8.
                                super__Vector_base<tinyusdz::value::matrix4d,_std::allocator<tinyusdz::value::matrix4d>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::
        emplace_back<tinyusdz::tydra::SkelNode>(&parentNode->children,(SkelNode *)local_190);
        ::std::vector<tinyusdz::tydra::SkelNode,_std::allocator<tinyusdz::tydra::SkelNode>_>::
        ~vector(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_p != &local_160) {
          operator_delete(local_170._M_p,
                          CONCAT71(local_160._M_allocated_capacity._1_7_,local_160._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
          operator_delete((void *)local_190._0_8_,CONCAT71(local_190._17_7_,local_190[0x10]) + 1);
        }
      }
      err_00 = (string *)((long)&(err_00->_M_dataplus)._M_p + 1);
      piVar3 = (parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (err_00 < (string *)
                      ((long)(parentJointIds->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                             .super__Vector_impl_data._M_finish - (long)piVar3 >> 2));
  }
  return SUB81(piVar3,0);
}

Assistant:

static bool BuildSkelHierarchyImpl(
    /* inout */ std::set<size_t> &visitSet,
    /* inout */ SkelNode &parentNode,
    const std::vector<int> &parentJointIds,
    const std::vector<value::token> &joints,
    const std::vector<value::token> &jointNames,
    const std::vector<value::matrix4d> bindTransforms,
    const std::vector<value::matrix4d> &restTransforms,
    std::string *err = nullptr) {
  // Simple linear search
  for (size_t i = 0; i < parentJointIds.size(); i++) {
    if (visitSet.count(i)) {
      continue;
    }

    int parentJointIdOfCurrIdx = parentJointIds[i];
    if (parentNode.joint_id == parentJointIdOfCurrIdx) {
      DCOUT("add joint " << i << "(parent = " << parentJointIdOfCurrIdx << ")");
      SkelNode node;
      node.joint_id = int(i);
      node.joint_path = joints[i].str();
      node.joint_name = jointNames[i].str();
      node.bind_transform = bindTransforms[i];
      node.rest_transform = restTransforms[i];

      visitSet.insert(i);

      // Recursively traverse children
      if (!BuildSkelHierarchyImpl(visitSet, node,
                                  parentJointIds, joints, jointNames, bindTransforms,
                                  restTransforms, err)) {
        return false;
      }

      parentNode.children.emplace_back(std::move(node));
    }
  }

  return true;
}